

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O3

void xcb_input_device_resolution_state_next(xcb_input_device_resolution_state_iterator_t *i)

{
  xcb_input_device_resolution_state_t *_aux;
  int iVar1;
  
  iVar1 = i->data->num_valuators * 0xc + 8;
  i->index = iVar1;
  i->rem = i->rem + -1;
  i->data = (xcb_input_device_resolution_state_t *)((long)&i->data->control_id + (long)iVar1);
  return;
}

Assistant:

void
xcb_input_device_resolution_state_next (xcb_input_device_resolution_state_iterator_t *i)
{
    xcb_input_device_resolution_state_t *R = i->data;
    xcb_generic_iterator_t child;
    child.data = (xcb_input_device_resolution_state_t *)(((char *)R) + xcb_input_device_resolution_state_sizeof(R));
    i->index = (char *) child.data - (char *) i->data;
    --i->rem;
    i->data = (xcb_input_device_resolution_state_t *) child.data;
}